

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.cpp
# Opt level: O2

void __thiscall CMU462::Timeline::draw(Timeline *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Timeline *pTVar3;
  int i;
  int element_type;
  Timeline *this_00;
  Timeline *pTVar4;
  _Self __tmp;
  double dVar5;
  undefined8 uVar6;
  double dVar7;
  double y1;
  double size;
  undefined8 uVar8;
  undefined8 uVar9;
  
  this_00 = this;
  glColor4f(0x3f800000,0x3f800000,0x3f800000,0x3f4ccccd);
  drawRectangle(this_00,(double)this->x,(double)this->y,(double)(this->x + this->w),
                (double)(this->y + this->h));
  dVar5 = (double)(this->h * -6 + this->w + this->x);
  for (element_type = 0; element_type != 6; element_type = element_type + 1) {
    dVar7 = (double)(this->h * element_type) + dVar5 + 2.0;
    y1 = (double)this->y + 2.0;
    size = (double)this->h + -4.0;
    glColor4f(0,0,0,0x3e99999a);
    drawRectangle(this_00,dVar7,y1,size + dVar7,size + y1);
    if (((element_type == 5) && (this->isLooping == true)) ||
       (element_type == this->selected_button_index)) {
      uVar6 = 0;
      uVar8 = 0x3f800000;
      uVar9 = uVar8;
    }
    else if (element_type == this->hover_button_index) {
      uVar8 = 0;
      uVar6 = 0x3f800000;
      uVar9 = uVar6;
    }
    else {
      uVar8 = 0;
      uVar6 = 0x3e99999a;
      uVar9 = 0x3f4ccccd;
    }
    glColor4f(uVar6,0,uVar8,uVar9);
    this_00 = this;
    drawButton(this,element_type,dVar7,y1,size);
  }
  glColor4f(0,0,0,0x3e99999a);
  glColor4f(0,0,0x3f800000,0x3f333333);
  dVar5 = dVar5 - (double)this->x;
  pTVar4 = (Timeline *)(this->times)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pTVar4 != (Timeline *)&(this->times)._M_t._M_impl.super__Rb_tree_header) {
    dVar7 = ((double)*(int *)&(pTVar4->times)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
            / (double)this->max_frame) * dVar5 + (double)this->x;
    drawRectangle(this_00,dVar7,(double)this->y + 4.0,dVar7 + 1.0,(double)(this->y + this->h) + -4.0
                 );
    pTVar3 = (Timeline *)std::_Rb_tree_increment((_Rb_tree_node_base *)pTVar4);
    this_00 = pTVar4;
    pTVar4 = pTVar3;
  }
  glColor4f(0x3f800000,0,0,0x3f800000);
  uVar1 = this->current_frame;
  uVar2 = this->max_frame;
  dVar5 = ((double)(int)uVar1 / (double)(int)uVar2) * dVar5 + (double)this->x;
  drawRectangle(this_00,dVar5 + -2.0,(double)this->y + 2.0,dVar5,(double)(this->y + this->h) + -2.0)
  ;
  return;
}

Assistant:

void Timeline::draw() {
  // -- White with opacity .8;
  glColor4f(1.0, 1.0, 1.0, 0.8);

  drawRectangle(x, y, x + w, y + h);

  double button_start_x = getButtonStartX();
  double border_size = 2;

  for (int i = 0; i < 6; i++) {
    // Draw each button.
    // Draw a button highlighted if hover_button_index == i.
    double b_x = button_start_x + i * h + border_size;
    double b_y = y + border_size;
    double size = h - border_size * 2;

    // Backgrounds for each button.
    // Black with opacity .3
    glColor4f(0.0, 0.0, 0.0, 0.3);
    drawRectangle(b_x, b_y, b_x + size, b_y + size);

    // Boolean button is enabled.
    if (i == LOOP && isLooping) {
      glColor4f(0.0, 0.0, 1.0, 1.0);
    }
    else if (selected_button_index == i) {
      glColor4f(0.0, 0.0, 1.0, 1.0);
    }
    else if (hover_button_index == i) {
      glColor4f(1.0, 0.0, 0.0, 1.0);
    }
    // Default, no hover, not enabled.
    else {
      // Faded red.
      glColor4f(0.3, 0.0, 0.0, 0.8);
    }

    drawButton(i, b_x, b_y, size);
  }

  // -- Draw the timeline with its various key frame locations.

  // First draw the timeline background.
  // Black with opacity .3
  glColor4f(0.0, 0.0, 0.0, 0.3);

  // Key frame time indicator color, (BLUE).
  glColor4f(0.0, 0.0, 1.0, .7);

  double line_w = button_start_x - x;

  for (set<int>::iterator iter = times.begin(); iter != times.end(); iter++) {
    // Draw a rectangle at x + (*iter)/max_frame * w to indicate keyframe times
    double t_x = x + (*iter) * 1.0 / max_frame * line_w;
    drawRectangle(t_x, y + border_size * 2, t_x + 1, y + h - border_size * 2);
  }

  glColor4f(1.0, 0.0, 0.0, 1.0);

  double current_x = x + current_frame * 1.0 / max_frame * line_w;
  drawRectangle(current_x - 2, y + border_size, current_x, y + h - border_size);
}